

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O3

void PaUtil_SetNonInterleavedInputChannel(PaUtilBufferProcessor *bp,uint channel,void *data)

{
  if (bp->inputChannelCount <= channel) {
    __assert_fail("channel < bp->inputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_process.c"
                  ,0x1f1,
                  "void PaUtil_SetNonInterleavedInputChannel(PaUtilBufferProcessor *, unsigned int, void *)"
                 );
  }
  if (bp->hostInputIsInterleaved == 0) {
    bp->hostInputChannels[0][channel].data = data;
    bp->hostInputChannels[0][channel].stride = 1;
    return;
  }
  __assert_fail("!bp->hostInputIsInterleaved",
                "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_process.c"
                ,0x1f2,
                "void PaUtil_SetNonInterleavedInputChannel(PaUtilBufferProcessor *, unsigned int, void *)"
               );
}

Assistant:

void PaUtil_SetNonInterleavedInputChannel( PaUtilBufferProcessor* bp,
        unsigned int channel, void *data )
{
    assert( channel < bp->inputChannelCount );
    assert( !bp->hostInputIsInterleaved );
    
    bp->hostInputChannels[0][channel].data = data;
    bp->hostInputChannels[0][channel].stride = 1;
}